

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_active_best_quality(AV1_COMP *cpi,int active_worst_quality,int cq_level,int gf_index)

{
  aom_bit_depth_t bit_depth_00;
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  GF_GROUP *gf_group_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  bool bVar5;
  int this_height;
  int boost;
  int min_boost;
  int q;
  int is_overlay_frame;
  int is_leaf_frame;
  int is_intrl_arf_boost;
  int active_best_quality;
  int *inter_minq;
  aom_rc_mode rc_mode;
  GF_GROUP *gf_group;
  RefreshFrameInfo *refresh_frame;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  int bit_depth;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff72;
  bool bVar6;
  int local_88;
  int local_7c;
  int local_6c;
  int *local_68;
  int local_4;
  
  bit_depth_00 = *(aom_bit_depth_t *)(in_RDI[0x8401] + 0x48);
  lVar2 = *in_RDI;
  gf_group_00 = (GF_GROUP *)(*in_RDI + 400);
  iVar1 = *(int *)((long)in_RDI + 0x423dc);
  if (bit_depth_00 == AOM_BITS_8) {
    local_68 = inter_minq_8;
  }
  else if (bit_depth_00 == AOM_BITS_10) {
    local_68 = inter_minq_10;
  }
  else if (bit_depth_00 == AOM_BITS_12) {
    local_68 = inter_minq_12;
  }
  else {
    local_68 = (int *)0x0;
  }
  bVar5 = gf_group_00->update_type[in_ECX] == '\x06';
  bVar6 = true;
  if ((gf_group_00->update_type[in_ECX] != '\x03') &&
     (bVar6 = true, gf_group_00->update_type[in_ECX] != '\x02')) {
    bVar6 = bVar5;
  }
  bVar3 = bVar6;
  if (((*(int *)((long)in_RDI + 0x42264) != 0) &&
      (in_stack_ffffffffffffff72 = true, bVar3 = true, (*(byte *)(in_RDI + 0x85af) & 1) == 0)) &&
     (in_stack_ffffffffffffff72 = true, bVar3 = true, (*(byte *)((long)in_RDI + 0x42d7a) & 1) == 0))
  {
    in_stack_ffffffffffffff72 = bVar5;
    bVar3 = bVar5;
  }
  if ((((bVar3 ^ 0xffU) & 1) == 0) && ((int)in_RDI[0xc0f5] == 0)) {
    local_7c = in_ESI;
    if ((1 < (int)in_RDI[0xc0f4]) && (*(int *)(lVar2 + 0xacc0) < in_ESI)) {
      local_7c = *(int *)(lVar2 + 0xacc0);
    }
    if ((iVar1 == 2) && (local_7c < in_EDX)) {
      local_7c = in_EDX;
    }
    local_6c = get_gf_active_quality
                         ((PRIMARY_RATE_CONTROL *)
                          CONCAT44(bit_depth_00,
                                   CONCAT13(bVar6,CONCAT12(in_stack_ffffffffffffff72,
                                                           in_stack_ffffffffffffff70))),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (iVar1 == 2) {
      local_6c = (local_6c * 0xf) / 0x10;
    }
    iVar4 = get_gf_high_motion_quality(local_7c,bit_depth_00);
    local_6c = iVar4 - (int)((float)(iVar4 - local_6c) * *(float *)(lVar2 + 0xac8c));
    local_4 = local_6c;
    if (bVar5) {
      if ((iVar1 == 3) || (iVar1 == 2)) {
        local_6c = *(int *)(lVar2 + 0xac88);
      }
      for (local_88 = gf_group_pyramid_level(gf_group_00,in_ECX); 1 < local_88;
          local_88 = local_88 + -1) {
        local_6c = (local_6c + in_ESI + 1) / 2;
      }
      local_4 = local_6c;
    }
  }
  else {
    local_4 = in_EDX;
    if (iVar1 != 3) {
      local_6c = local_68[in_ESI];
      if ((iVar1 == 2) && (local_6c < in_EDX)) {
        local_6c = in_EDX;
      }
      local_4 = local_6c;
    }
  }
  return local_4;
}

Assistant:

static int get_active_best_quality(const AV1_COMP *const cpi,
                                   const int active_worst_quality,
                                   const int cq_level, const int gf_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const int bit_depth = cm->seq_params->bit_depth;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const enum aom_rc_mode rc_mode = oxcf->rc_cfg.mode;
  int *inter_minq;
  ASSIGN_MINQ_TABLE(bit_depth, inter_minq);
  int active_best_quality = 0;
  const int is_intrl_arf_boost =
      gf_group->update_type[gf_index] == INTNL_ARF_UPDATE;
  int is_leaf_frame =
      !(gf_group->update_type[gf_index] == ARF_UPDATE ||
        gf_group->update_type[gf_index] == GF_UPDATE || is_intrl_arf_boost);

  // TODO(jingning): Consider to rework this hack that covers issues incurred
  // in lightfield setting.
  if (cm->tiles.large_scale) {
    is_leaf_frame = !(refresh_frame->golden_frame ||
                      refresh_frame->alt_ref_frame || is_intrl_arf_boost);
  }
  const int is_overlay_frame = rc->is_src_frame_alt_ref;

  if (is_leaf_frame || is_overlay_frame) {
    if (rc_mode == AOM_Q) return cq_level;

    active_best_quality = inter_minq[active_worst_quality];
    // For the constrained quality mode we don't want
    // q to fall below the cq level.
    if ((rc_mode == AOM_CQ) && (active_best_quality < cq_level)) {
      active_best_quality = cq_level;
    }
    return active_best_quality;
  }

  // Determine active_best_quality for frames that are not leaf or overlay.
  int q = active_worst_quality;
  // Use the lower of active_worst_quality and recent
  // average Q as basis for GF/ARF best Q limit unless last frame was
  // a key frame.
  if (rc->frames_since_key > 1 &&
      p_rc->avg_frame_qindex[INTER_FRAME] < active_worst_quality) {
    q = p_rc->avg_frame_qindex[INTER_FRAME];
  }
  if (rc_mode == AOM_CQ && q < cq_level) q = cq_level;
  active_best_quality = get_gf_active_quality(p_rc, q, bit_depth);
  // Constrained quality use slightly lower active best.
  if (rc_mode == AOM_CQ) active_best_quality = active_best_quality * 15 / 16;
  const int min_boost = get_gf_high_motion_quality(q, bit_depth);
  const int boost = min_boost - active_best_quality;
  active_best_quality = min_boost - (int)(boost * p_rc->arf_boost_factor);
  if (!is_intrl_arf_boost) return active_best_quality;

  if (rc_mode == AOM_Q || rc_mode == AOM_CQ) active_best_quality = p_rc->arf_q;
  int this_height = gf_group_pyramid_level(gf_group, gf_index);
  while (this_height > 1) {
    active_best_quality = (active_best_quality + active_worst_quality + 1) / 2;
    --this_height;
  }
  return active_best_quality;
}